

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::walkTree<0,(TasGrid::RuleLocal::erule)4>
          (GridLocalPolynomial *this,MultiIndexSet *work,double *x,
          vector<int,_std::allocator<int>_> *sindx,vector<double,_std::allocator<double>_> *svals,
          double *y)

{
  int iVar1;
  value_type vVar2;
  bool bVar3;
  reference piVar4;
  int *piVar5;
  double *pdVar6;
  reference pvVar7;
  const_reference pvVar8;
  int local_f4;
  int k_1;
  double *s_1;
  int local_e0;
  int p;
  int current;
  int k;
  double *s;
  int *r;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  undefined1 local_a8 [8];
  vector<double,_std::allocator<double>_> basis_derivative;
  double basis_value;
  undefined1 local_80 [6];
  bool isSupported;
  vector<int,_std::allocator<int>_> monkey_tail;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> monkey_count;
  double *y_local;
  vector<double,_std::allocator<double>_> *svals_local;
  vector<int,_std::allocator<int>_> *sindx_local;
  double *x_local;
  MultiIndexSet *work_local;
  GridLocalPolynomial *this_local;
  
  iVar1 = this->top_level;
  monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)y;
  ::std::allocator<int>::allocator(&local_51);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,(long)(iVar1 + 1),&local_51);
  ::std::allocator<int>::~allocator(&local_51);
  iVar1 = this->top_level;
  ::std::allocator<int>::allocator((allocator<int> *)((long)&basis_value + 7));
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,(long)(iVar1 + 1),
             (allocator<int> *)((long)&basis_value + 7));
  ::std::allocator<int>::~allocator((allocator<int> *)((long)&basis_value + 7));
  iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::allocator<double>::allocator((allocator<double> *)((long)&__range2 + 7));
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a8,(long)iVar1,
             (allocator<double> *)((long)&__range2 + 7));
  ::std::allocator<double>::~allocator((allocator<double> *)((long)&__range2 + 7));
  __end2._M_current =
       (int *)::std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&this->roots);
  r = (int *)::std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)&this->roots);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&r), bVar3) {
    piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end2);
    piVar5 = MultiIndexSet::getIndex(work,*piVar4);
    basis_derivative.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)evalBasisSupported<(TasGrid::RuleLocal::erule)4>
                            (this,piVar5,x,(bool *)((long)&basis_value + 6));
    if ((basis_value._6_1_ & 1) != 0) {
      pdVar6 = Data2D<double>::getStrip(&this->surpluses,*piVar4);
      for (p = 0; p < (this->super_BaseCanonicalGrid).num_outputs; p = p + 1) {
        *(double *)
         (monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage + (long)p * 2) =
             (double)basis_derivative.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage * pdVar6[p] +
             *(double *)
              (monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + (long)p * 2);
      }
      local_e0 = 0;
      iVar1 = *piVar4;
      pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_80,0);
      *pvVar7 = iVar1;
      pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&this->pntr,(long)*piVar4);
      vVar2 = *pvVar8;
      pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_50,0);
      *pvVar7 = vVar2;
      while( true ) {
        pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,0);
        iVar1 = *pvVar7;
        pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_80,0);
        pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&this->pntr,(long)(*pvVar7 + 1));
        if (*pvVar8 <= iVar1) break;
        pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,(long)local_e0);
        iVar1 = *pvVar7;
        pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_80,(long)local_e0);
        pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&this->pntr,(long)(*pvVar7 + 1));
        if (iVar1 < *pvVar8) {
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_50,(long)local_e0);
          pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&this->indx,(long)*pvVar7);
          iVar1 = *pvVar8;
          piVar5 = MultiIndexSet::getIndex(work,iVar1);
          basis_derivative.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)evalBasisSupported<(TasGrid::RuleLocal::erule)4>
                                  (this,piVar5,x,(bool *)((long)&basis_value + 6));
          if ((basis_value._6_1_ & 1) == 0) {
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_50,(long)local_e0);
            *pvVar7 = *pvVar7 + 1;
          }
          else {
            pdVar6 = Data2D<double>::getStrip(&this->surpluses,iVar1);
            for (local_f4 = 0; local_f4 < (this->super_BaseCanonicalGrid).num_outputs;
                local_f4 = local_f4 + 1) {
              *(double *)
               (monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + (long)local_f4 * 2) =
                   (double)basis_derivative.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage * pdVar6[local_f4] +
                   *(double *)
                    (monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + (long)local_f4 * 2);
            }
            local_e0 = local_e0 + 1;
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_80,(long)local_e0);
            *pvVar7 = iVar1;
            pvVar8 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)&this->pntr,(long)iVar1);
            vVar2 = *pvVar8;
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_50,(long)local_e0);
            *pvVar7 = vVar2;
          }
        }
        else {
          local_e0 = local_e0 + -1;
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_50,(long)local_e0);
          *pvVar7 = *pvVar7 + 1;
        }
      }
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
  }
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a8);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void walkTree(const MultiIndexSet &work, const double x[], std::vector<int> &sindx, std::vector<double> &svals, double *y) const{
        std::vector<int> monkey_count(top_level+1); // traverse the tree, counts the branches of the current node
        std::vector<int> monkey_tail(top_level+1); // traverse the tree, keeps track of the previous node (history)

        bool isSupported;
        double basis_value;
        std::vector<double> basis_derivative(num_dimensions);

        for(const auto &r : roots){
            if (mode == 3 or mode == 4) {
                diffBasisSupported<effrule>(work.getIndex(r), x, basis_derivative.data(), isSupported);
            } else {
                basis_value = evalBasisSupported<effrule>(work.getIndex(r), x, isSupported);
            }

            if (isSupported){
                if (mode == 0){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        y[k] += basis_value * s[k];
                }else if (mode == 1 or mode == 2){
                    sindx.push_back(r);
                    svals.push_back(basis_value);
                }else if (mode == 3){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        for (int d=0; d<num_dimensions; d++)
                            y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                }else{
                    sindx.push_back(r);
                    for (auto dx : basis_derivative)
                        svals.push_back(dx);
                }

                int current = 0;
                monkey_tail[0] = r;
                monkey_count[0] = pntr[r];

                while(monkey_count[0] < pntr[monkey_tail[0]+1]){
                    if (monkey_count[current] < pntr[monkey_tail[current]+1]){
                        int p = indx[monkey_count[current]];
                        if (mode == 3 or mode == 4){
                            diffBasisSupported<effrule>(work.getIndex(p), x, basis_derivative.data(), isSupported);
                        }else{
                            basis_value = evalBasisSupported<effrule>(work.getIndex(p), x, isSupported);
                        }
                        if (isSupported){
                            if (mode == 0){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    y[k] += basis_value * s[k];
                            }else if (mode == 1 or mode == 2){
                                sindx.push_back(p);
                                svals.push_back(basis_value);
                            }else if (mode == 3){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    for (int d=0; d<num_dimensions; d++)
                                        y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                            }else{
                                sindx.push_back(p);
                                for (auto dx : basis_derivative)
                                    svals.push_back(dx);
                            }
                            monkey_tail[++current] = p;
                            monkey_count[current] = pntr[p];
                        }else{
                            monkey_count[current]++;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }

        // according to https://docs.nvidia.com/cuda/cusparse/index.html#sparse-format
        // "... it is assumed that the indices are provided in increasing order and that each index appears only once."
        // This may not be a requirement for cusparseDgemvi(), but it may be that I have not tested it sufficiently
        // Also, see AccelerationDataGPUFull::cusparseMatveci() for inaccuracies in Nvidia documentation
        if (mode == 2){
            std::vector<int> map(sindx);
            std::iota(map.begin(), map.end(), 0);
            std::sort(map.begin(), map.end(), [&](int a, int b)->bool{ return (sindx[a] < sindx[b]); });

            std::vector<int> idx = sindx;
            std::vector<double> vls = svals;
            std::transform(map.begin(), map.end(), sindx.begin(), [&](int i)->int{ return idx[i]; });
            std::transform(map.begin(), map.end(), svals.begin(), [&](int i)->double{ return vls[i]; });
        }
    }